

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::shortStringReplacement_abi_cxx11_(char U)

{
  initializer_list<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  string *in_RDI;
  const_iterator res;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff9c8;
  allocator<char> *in_stack_fffffffffffff9d8;
  undefined7 in_stack_fffffffffffff9e0;
  char in_stack_fffffffffffff9e7;
  size_type in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e8;
  allocator<char> local_5c1;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5c0;
  _Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_5b8;
  unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  undefined1 local_548 [40];
  undefined1 local_520 [40];
  undefined1 local_4f8 [40];
  undefined1 local_4d0 [40];
  undefined1 local_4a8 [40];
  undefined1 local_480 [40];
  undefined1 local_458 [40];
  undefined1 local_430 [40];
  undefined1 local_408 [40];
  undefined1 local_3e0 [40];
  undefined1 local_3b8 [40];
  undefined1 local_390 [40];
  undefined1 local_368 [40];
  undefined1 local_340 [40];
  undefined1 local_318 [40];
  undefined1 local_2f0 [40];
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined1 local_250 [40];
  undefined1 local_228 [40];
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [40];
  undefined1 local_188 [40];
  undefined1 local_160 [40];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined1 local_e8 [40];
  undefined1 local_c0 [40];
  undefined1 local_98 [40];
  undefined1 local_70 [40];
  undefined1 local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  if ((shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&shortStringReplacement[abi:cxx11](char)::
                                   singleCharUnitStrings_abi_cxx11_), iVar2 != 0)) {
    local_578 = &local_570;
    local_5b0._M_h._M_single_bucket._7_1_ = 0x6d;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_548;
    local_5b0._M_h._M_rehash_policy._M_max_load_factor._3_1_ = 0x73;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
    local_5b0._M_h._M_rehash_policy._M_max_load_factor._2_1_ = 0x53;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [8])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8;
    local_5b0._M_h._M_rehash_policy._M_max_load_factor._1_1_ = 0x6c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d0;
    local_5b0._M_h._M_rehash_policy._M_max_load_factor._0_1_ = 0x67;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8;
    local_5b0._M_h._M_element_count._7_1_ = 0x62;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
    local_5b0._M_h._M_element_count._6_1_ = 0x72;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[12],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [12])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
    local_5b0._M_h._M_element_count._5_1_ = 0x56;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430;
    local_5b0._M_h._M_element_count._4_1_ = 0x46;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408;
    local_5b0._M_h._M_element_count._3_1_ = 0x79;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
    local_5b0._M_h._M_element_count._2_1_ = 0x70;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
    local_5b0._M_h._M_element_count._1_1_ = 0x4b;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
    local_5b0._M_h._M_element_count._0_1_ = 0x61;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [4])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368;
    local_5b0._M_h._M_before_begin._M_nxt._7_1_ = 0x4e;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
    local_5b0._M_h._M_before_begin._M_nxt._6_1_ = 100;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [4])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
    local_5b0._M_h._M_before_begin._M_nxt._5_1_ = 0x42;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0;
    local_5b0._M_h._M_before_begin._M_nxt._4_1_ = 0x58;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[3],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [3])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8;
    local_5b0._M_h._M_before_begin._M_nxt._3_1_ = 0x54;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0;
    local_5b0._M_h._M_before_begin._M_nxt._2_1_ = 0x55;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
    local_5b0._M_h._M_before_begin._M_nxt._1_1_ = 0x4d;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250;
    local_5b0._M_h._M_before_begin._M_nxt._0_1_ = 0x50;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
    local_5b0._M_h._M_bucket_count._7_1_ = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
    local_5b0._M_h._M_bucket_count._6_1_ = 0x41;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
    local_5b0._M_h._M_bucket_count._5_1_ = 0x43;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[8],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [8])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
    local_5b0._M_h._M_bucket_count._4_1_ = 0x4a;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
    local_5b0._M_h._M_bucket_count._3_1_ = 0x48;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    local_5b0._M_h._M_bucket_count._2_1_ = 0x47;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
    local_5b0._M_h._M_bucket_count._1_1_ = 0x68;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
    local_5b0._M_h._M_bucket_count._0_1_ = 0x44;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[4],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [4])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    local_5b0._M_h._M_buckets._7_1_ = 0x6f;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    local_5b0._M_h._M_buckets._6_1_ = 0x4c;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[7],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [7])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
    local_5b0._M_h._M_buckets._5_1_ = 0x57;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[5],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [5])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    local_5b0._M_h._M_buckets._4_1_ = 0x65;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[17],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [17])in_stack_fffffffffffff9f0);
    local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
    local_5b0._M_h._M_buckets._3_1_ = 0x74;
    std::
    pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<char,_const_char_(&)[6],_true>
              (in_stack_fffffffffffffa00,
               (char *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
               (char (*) [6])in_stack_fffffffffffff9f0);
    local_20._M_dataplus._M_p = (pointer)&local_570;
    local_20._M_string_length = 0x22;
    in_stack_fffffffffffff9c8 = &local_5b0;
    std::
    allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x7a4a42);
    __l._M_array._4_4_ = in_stack_fffffffffffff9fc;
    __l._M_array._0_4_ = in_stack_fffffffffffff9f8;
    __l._M_len = (size_type)in_stack_fffffffffffffa00;
    std::
    unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff9f0,__l,in_stack_fffffffffffff9e8,
                    (hasher *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0),
                    (key_equal *)in_stack_fffffffffffff9d8,
                    (allocator_type *)in_stack_fffffffffffffa10);
    std::
    allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_5b0);
    in_stack_fffffffffffffa10 = &local_570;
    local_5e8 = &local_20;
    do {
      in_stack_fffffffffffffa08 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&local_5e8[-2].field_2 + 8);
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x7a4ab7);
      local_5e8 = in_stack_fffffffffffffa08;
    } while (in_stack_fffffffffffffa08 != in_stack_fffffffffffffa10);
    __cxa_atexit(std::
                 unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~unordered_map,
                 &shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_);
  }
  local_5b8._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffff9c8,(key_type *)0x7a4b05);
  local_5c0._M_cur =
       (__node_type *)
       std::
       unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffff9c8);
  bVar1 = std::__detail::operator==(&local_5b8,&local_5c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e7,
               in_stack_fffffffffffff9d8);
    std::allocator<char>::~allocator(&local_5c1);
  }
  else {
    std::__detail::
    _Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
    ::operator->((_Node_const_iterator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)0x7a4b84);
    std::__cxx11::string::string(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  }
  return in_RDI;
}

Assistant:

static std::string shortStringReplacement(char U)
{
    // LCOV_EXCL_START
    // not sure why this isn't showing up as covered
    static const std::unordered_map<char, std::string> singleCharUnitStrings{
        {'m', "meter"},       {'s', "second"}, {'S', "siemens"},
        {'l', "liter"},       {'g', "gram"},   {'b', "barn"},
        {'r', "revolutions"}, {'V', "volt"},   {'F', "farad"},
        {'y', "year"},        {'p', "poise"},  {'K', "kelvin"},
        {'a', "are"},         {'N', "newton"}, {'d', "day"},
        {'B', "byte"},        {'X', "xu"},     {'T', "tesla"},
        {'U', "units"},       {'M', "molar"},  {'P', "poise"},
        {'W', "watt"},        {'A', "ampere"}, {'C', "coulomb"},
        {'J', "joule"},       {'H', "henry"},  {'G', "gauss"},
        {'h', "hour"},        {'D', "day"},    {'o', "arcdeg"},
        {'L', "liter "},      {'W', "watt"},   {'e', "elementarycharge"},
        {'t', "tonne"}};

    // LCOV_EXCL_STOP

    auto res = singleCharUnitStrings.find(U);
    return (res == singleCharUnitStrings.end()) ? std::string(1, U) :
                                                  res->second;
}